

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeMahonyFilter.cpp
# Opt level: O0

bool __thiscall
iDynTree::AttitudeMahonyFilter::updateFilterWithMeasurements
          (AttitudeMahonyFilter *this,LinearAccelerometerMeasurements *linAccMeas,
          GyroscopeMeasurements *gyroMeas)

{
  undefined1 uVar1;
  byte bVar2;
  bool bVar3;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_RDX;
  char *in_RSI;
  allocator<char> *in_RDI;
  Rotation *in_stack_00000060;
  double in_stack_00000068;
  Direction *in_stack_00000070;
  Vector3 in_stack_00000080;
  Matrix3x3 S_acc;
  Vector3 linAccMeasUnitVector;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *this_00;
  Vector3 *out;
  undefined6 in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 in_stack_fffffffffffffecf;
  string *in_stack_fffffffffffffed0;
  Vector3 *in_stack_fffffffffffffed8;
  VectorFixSize<3U> local_98;
  undefined1 local_79 [56];
  undefined1 local_41 [33];
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *local_20;
  bool local_1;
  
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_41;
  local_20 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,in_RSI,in_RDI);
  uVar1 = checkValidMeasurement
                    (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                     (bool)in_stack_fffffffffffffecf);
  bVar2 = uVar1 ^ 0xff;
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  if ((bVar2 & 1) == 0) {
    out = (Vector3 *)local_79;
    this_00 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,in_RSI,in_RDI);
    bVar3 = checkValidMeasurement
                      (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                       (bool)in_stack_fffffffffffffecf);
    std::__cxx11::string::~string((string *)(local_79 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_79);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      VectorFixSize<3U>::VectorFixSize(&local_98);
      bVar3 = getUnitVector((Vector3 *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_fffffffffffffe98)),out
                           );
      if (bVar3) {
        getAngVelSkewSymmetricMatrixFromMeasurements
                  (in_stack_00000080,in_stack_00000070,in_stack_00000068,in_stack_00000060);
        mapso3ToR3((Matrix3x3 *)this_01);
        toEigen<3U>((VectorFixSize<3U> *)this_00);
        Eigen::
        DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
        ::operator-(this_00);
        toEigen<3U>((VectorFixSize<3U> *)this_00);
        Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
                  ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
                   local_98.m_data[1],
                   (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)local_98.m_data[0]);
        *(undefined8 *)(in_RDI + 0x148) = *(undefined8 *)local_20;
        *(double *)(in_RDI + 0x150) = *(double *)(local_20 + 8);
        *(double *)(in_RDI + 0x158) = *(double *)(local_20 + 0x10);
        local_1 = true;
      }
      else {
        iDynTree::reportError
                  ("AttitudeMahonyFilter","updateFilterWithMeasurements",
                   "Cannot retrieve unit vector from linear acceleration measuremnts.");
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool iDynTree::AttitudeMahonyFilter::updateFilterWithMeasurements(const iDynTree::LinearAccelerometerMeasurements& linAccMeas, const iDynTree::GyroscopeMeasurements& gyroMeas)
{
    using iDynTree::toEigen;

    if (!checkValidMeasurement(linAccMeas, "linear acceleration", true)) { return false; }
    if (!checkValidMeasurement(gyroMeas, "gyroscope", false)) { return false; }

    iDynTree::Vector3 linAccMeasUnitVector;
    if (!getUnitVector(linAccMeas, linAccMeasUnitVector))
    {
        iDynTree::reportError("AttitudeMahonyFilter", "updateFilterWithMeasurements", "Cannot retrieve unit vector from linear acceleration measuremnts.");
        return false;
    }

    iDynTree::Matrix3x3 S_acc = getAngVelSkewSymmetricMatrixFromMeasurements(linAccMeasUnitVector, m_gravity_direction, 1-m_params_mahony.confidence_magnetometer_measurements, m_orientationInSO3);
    toEigen(m_omega_mes) = -toEigen(mapso3ToR3(S_acc));
    m_Omega_y = gyroMeas;

    return true;
}